

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

SAM_RG * sam_hdr_find_rg(SAM_hdr *hdr,char *rg)

{
  khint_t kVar1;
  uint uVar2;
  kh_m_s2i_t *pkVar3;
  khint32_t *pkVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  SAM_RG *pSVar8;
  byte bVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  
  pkVar3 = hdr->rg_hash;
  kVar1 = pkVar3->n_buckets;
  if (kVar1 == 0) {
    uVar6 = 0;
  }
  else {
    uVar11 = (uint)*rg;
    if (*rg == '\0') {
      uVar11 = 0;
    }
    else {
      cVar5 = rg[1];
      if (cVar5 != '\0') {
        pcVar10 = rg + 2;
        do {
          uVar11 = (int)cVar5 + uVar11 * 0x1f;
          cVar5 = *pcVar10;
          pcVar10 = pcVar10 + 1;
        } while (cVar5 != '\0');
      }
    }
    uVar11 = uVar11 & kVar1 - 1;
    pkVar4 = pkVar3->flags;
    iVar13 = 1;
    uVar12 = uVar11;
    do {
      uVar2 = pkVar4[uVar12 >> 4];
      bVar9 = (char)uVar12 * '\x02' & 0x1e;
      uVar6 = uVar2 >> bVar9;
      if (((uVar6 & 2) != 0) ||
         (((uVar6 & 1) == 0 && (iVar7 = strcmp(pkVar3->keys[uVar12],rg), iVar7 == 0)))) {
        uVar6 = uVar12;
        if ((uVar2 >> bVar9 & 3) != 0) {
          uVar6 = kVar1;
        }
        break;
      }
      uVar12 = uVar12 + iVar13 & kVar1 - 1;
      iVar13 = iVar13 + 1;
      uVar6 = kVar1;
    } while (uVar12 != uVar11);
  }
  if (uVar6 == kVar1) {
    pSVar8 = (SAM_RG *)0x0;
  }
  else {
    pSVar8 = hdr->rg + pkVar3->vals[uVar6];
  }
  return pSVar8;
}

Assistant:

SAM_RG *sam_hdr_find_rg(SAM_hdr *hdr, const char *rg) {
    khint_t k = kh_get(m_s2i, hdr->rg_hash, rg);
    return k == kh_end(hdr->rg_hash)
	? NULL
	: &hdr->rg[kh_val(hdr->rg_hash, k)];
}